

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.cc
# Opt level: O2

void __thiscall
fmt::internal::PrintfFormatter<char>::format
          (PrintfFormatter<char> *this,BasicWriter<char> *writer,BasicCStringRef<char> format_str)

{
  char *end;
  char *pcVar1;
  char cVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  FormatError *this_00;
  Arg *pAVar6;
  char *s;
  Arg *local_80;
  FormatSpec *local_78;
  FormatSpec local_70;
  Arg arg;
  
  s = format_str.data_;
  do {
    while( true ) {
      do {
        pcVar1 = s;
        if (*s == '\0') {
          FormatterBase::write<char>(&this->super_FormatterBase,writer,format_str.data_,s);
          return;
        }
        end = s + 1;
        cVar2 = *s;
        s = end;
      } while (cVar2 != '%');
      if (*end != '%') break;
      FormatterBase::write<char>(&this->super_FormatterBase,writer,format_str.data_,end);
      format_str.data_ = s + 1;
      s = format_str.data_;
    }
    FormatterBase::write<char>(&this->super_FormatterBase,writer,format_str.data_,pcVar1);
    local_70.super_AlignSpec.super_WidthSpec.width_ = 0;
    local_70.super_AlignSpec.super_WidthSpec.fill_ = L' ';
    local_70.super_AlignSpec.align_ = ALIGN_RIGHT;
    local_70.flags_ = 0;
    local_70.precision_ = 0xffffffff;
    local_70.type_ = '\0';
    uVar4 = parse_header(this,&s,&local_70);
    pcVar1 = s;
    if (*s == '.') {
      if ((byte)(s[1] - 0x30U) < 10) {
        s = s + 1;
        local_70.precision_ = parse_nonnegative_int<char>(&s);
        pcVar1 = s;
      }
      else {
        pcVar1 = s + 1;
        if (s[1] == '*') {
          s = s + 2;
          pAVar6 = (Arg *)this;
          get_arg(&arg,this,s,0xffffffff);
          local_70.precision_ =
               ArgVisitor<fmt::(anonymous_namespace)::PrecisionHandler,_int>::visit
                         ((ArgVisitor<fmt::(anonymous_namespace)::PrecisionHandler,_int> *)&arg,
                          pAVar6);
          pcVar1 = s;
        }
      }
    }
    s = pcVar1;
    pAVar6 = (Arg *)this;
    get_arg(&arg,this,s,uVar4);
    uVar4 = local_70.flags_;
    if (((local_70._8_8_ & 0x800000000) != 0) &&
       (bVar3 = ArgVisitor<fmt::(anonymous_namespace)::IsZeroInt,_bool>::visit
                          ((ArgVisitor<fmt::(anonymous_namespace)::IsZeroInt,_bool> *)&arg,pAVar6),
       bVar3)) {
      local_70._8_8_ = CONCAT44(uVar4,local_70.super_AlignSpec.align_) & 0xfffffff7ffffffff;
    }
    if (local_70.super_AlignSpec.super_WidthSpec.fill_ == L'0') {
      if ((int)arg.type < 10) {
        local_70.super_AlignSpec.align_ = 4;
      }
      else {
        local_70.super_AlignSpec.super_WidthSpec.fill_ = L' ';
      }
    }
    pcVar1 = s + 1;
    cVar2 = *s;
    if (cVar2 != 'L') {
      if (cVar2 == 'z') {
        local_78 = (FormatSpec *)CONCAT44(local_78._4_4_,(int)*pcVar1);
        s = pcVar1;
        local_80 = &arg;
        ArgVisitor<fmt::(anonymous_namespace)::ArgConverter<unsigned_long>,_void>::visit
                  ((ArgVisitor<fmt::(anonymous_namespace)::ArgConverter<unsigned_long>,_void> *)
                   &local_80,&arg);
        pcVar1 = s;
      }
      else if (cVar2 == 'j') {
LAB_001263f4:
        iVar5 = (int)*pcVar1;
LAB_00126400:
        local_78 = (FormatSpec *)CONCAT44(local_78._4_4_,iVar5);
        s = pcVar1;
        local_80 = &arg;
        ArgVisitor<fmt::(anonymous_namespace)::ArgConverter<long>,_void>::visit
                  ((ArgVisitor<fmt::(anonymous_namespace)::ArgConverter<long>,_void> *)&local_80,
                   &arg);
        pcVar1 = s;
      }
      else if (cVar2 == 'l') {
        iVar5 = (int)*pcVar1;
        if (iVar5 != 0x6c) goto LAB_00126400;
        local_78 = (FormatSpec *)CONCAT44(local_78._4_4_,(int)s[2]);
        s = s + 2;
        local_80 = &arg;
        ArgVisitor<fmt::(anonymous_namespace)::ArgConverter<long_long>,_void>::visit
                  ((ArgVisitor<fmt::(anonymous_namespace)::ArgConverter<long_long>,_void> *)
                   &local_80,&arg);
        pcVar1 = s;
      }
      else {
        if (cVar2 == 't') goto LAB_001263f4;
        if (cVar2 == 'h') {
          if (*pcVar1 == 0x68) {
            local_78 = (FormatSpec *)CONCAT44(local_78._4_4_,(int)s[2]);
            s = s + 2;
            local_80 = &arg;
            ArgVisitor<fmt::(anonymous_namespace)::ArgConverter<signed_char>,_void>::visit
                      ((ArgVisitor<fmt::(anonymous_namespace)::ArgConverter<signed_char>,_void> *)
                       &local_80,&arg);
            pcVar1 = s;
          }
          else {
            local_78 = (FormatSpec *)CONCAT44(local_78._4_4_,(int)*pcVar1);
            s = pcVar1;
            local_80 = &arg;
            ArgVisitor<fmt::(anonymous_namespace)::ArgConverter<short>,_void>::visit
                      ((ArgVisitor<fmt::(anonymous_namespace)::ArgConverter<short>,_void> *)
                       &local_80,&arg);
            pcVar1 = s;
          }
        }
        else {
          local_78 = (FormatSpec *)CONCAT44(local_78._4_4_,(int)*s);
          local_80 = &arg;
          ArgVisitor<fmt::(anonymous_namespace)::ArgConverter<void>,_void>::visit
                    ((ArgVisitor<fmt::(anonymous_namespace)::ArgConverter<void>,_void> *)&local_80,
                     &arg);
          pcVar1 = s;
        }
      }
    }
    s = pcVar1;
    if (*s == '\0') {
      this_00 = (FormatError *)__cxa_allocate_exception(0x10);
      FormatError::FormatError(this_00,(CStringRef)0x12d15b);
      __cxa_throw(this_00,&FormatError::typeinfo,FormatError::~FormatError);
    }
    pcVar1 = s + 1;
    local_70.type_ = *s;
    s = pcVar1;
    if ((int)arg.type < 8) {
      if (local_70.type_ == 'c') {
        local_80 = &arg;
        ArgVisitor<fmt::(anonymous_namespace)::CharConverter,_void>::visit
                  ((ArgVisitor<fmt::(anonymous_namespace)::CharConverter,_void> *)&local_80,&arg);
      }
      else if ((local_70.type_ == 'u') || (local_70.type_ == 'i')) {
        local_70.type_ = 'd';
      }
    }
    format_str.data_ = s;
    local_78 = &local_70;
    local_80 = (Arg *)writer;
    ArgVisitor<fmt::internal::PrintfArgFormatter<char>,_void>::visit
              ((ArgVisitor<fmt::internal::PrintfArgFormatter<char>,_void> *)&local_80,&arg);
  } while( true );
}

Assistant:

void fmt::internal::PrintfFormatter<Char>::format(
    BasicWriter<Char> &writer, BasicCStringRef<Char> format_str) {
  const Char *start = format_str.c_str();
  const Char *s = start;
  while (*s) {
    Char c = *s++;
    if (c != '%') continue;
    if (*s == c) {
      write(writer, start, s);
      start = ++s;
      continue;
    }
    write(writer, start, s - 1);

    FormatSpec spec;
    spec.align_ = ALIGN_RIGHT;

    // Parse argument index, flags and width.
    unsigned arg_index = parse_header(s, spec);

    // Parse precision.
    if (*s == '.') {
      ++s;
      if ('0' <= *s && *s <= '9') {
        spec.precision_ = static_cast<int>(parse_nonnegative_int(s));
      } else if (*s == '*') {
        ++s;
        spec.precision_ = fmt::PrecisionHandler().visit(get_arg(s));
      }
    }

    Arg arg = get_arg(s, arg_index);
    if (spec.flag(HASH_FLAG) && fmt::IsZeroInt().visit(arg))
      spec.flags_ &= ~to_unsigned<int>(HASH_FLAG);
    if (spec.fill_ == '0') {
      if (arg.type <= Arg::LAST_NUMERIC_TYPE)
        spec.align_ = ALIGN_NUMERIC;
      else
        spec.fill_ = ' ';  // Ignore '0' flag for non-numeric types.
    }

    // Parse length and convert the argument to the required type.
    switch (*s++) {
    case 'h':
      if (*s == 'h')
        fmt::ArgConverter<signed char>(arg, *++s).visit(arg);
      else
        fmt::ArgConverter<short>(arg, *s).visit(arg);
      break;
    case 'l':
      if (*s == 'l')
        fmt::ArgConverter<fmt::LongLong>(arg, *++s).visit(arg);
      else
        fmt::ArgConverter<long>(arg, *s).visit(arg);
      break;
    case 'j':
      fmt::ArgConverter<intmax_t>(arg, *s).visit(arg);
      break;
    case 'z':
      fmt::ArgConverter<std::size_t>(arg, *s).visit(arg);
      break;
    case 't':
      fmt::ArgConverter<std::ptrdiff_t>(arg, *s).visit(arg);
      break;
    case 'L':
      // printf produces garbage when 'L' is omitted for long double, no
      // need to do the same.
      break;
    default:
      --s;
      fmt::ArgConverter<void>(arg, *s).visit(arg);
    }

    // Parse type.
    if (!*s)
      FMT_THROW(FormatError("invalid format string"));
    spec.type_ = static_cast<char>(*s++);
    if (arg.type <= Arg::LAST_INTEGER_TYPE) {
      // Normalize type.
      switch (spec.type_) {
      case 'i': case 'u':
        spec.type_ = 'd';
        break;
      case 'c':
        // TODO: handle wchar_t
        fmt::CharConverter(arg).visit(arg);
        break;
      }
    }

    start = s;

    // Format argument.
    internal::PrintfArgFormatter<Char>(writer, spec).visit(arg);
  }
  write(writer, start, s);
}